

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_thread.c
# Opt level: O2

void * nni_plat_thr_main(void *arg)

{
  undefined1 local_98 [8];
  sigset_t set;
  
  sigemptyset((sigset_t *)local_98);
  sigaddset((sigset_t *)local_98,0xd);
  pthread_sigmask(0,(sigset_t *)local_98,(__sigset_t *)0x0);
  (**(code **)((long)arg + 8))(*(undefined8 *)((long)arg + 0x10));
  return (void *)0x0;
}

Assistant:

static void *
nni_plat_thr_main(void *arg)
{
	nni_plat_thr *thr = arg;
	sigset_t      set;

	// Suppress (block) SIGPIPE for this thread.
	sigemptyset(&set);
	sigaddset(&set, SIGPIPE);
	(void) pthread_sigmask(SIG_BLOCK, &set, NULL);

	thr->func(thr->arg);
	return (NULL);
}